

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<vkb::Device> * __thiscall
vkb::DeviceBuilder::build(Result<vkb::Device> *__return_storage_ptr__,DeviceBuilder *this)

{
  VkPhysicalDeviceFeatures *__src;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *__x;
  pointer pbVar1;
  VkBaseOutStructure **ppVVar2;
  undefined8 uVar3;
  VkSurfaceKHR pVVar4;
  VkAllocationCallbacks *pVVar5;
  bool bVar6;
  void *pvVar7;
  VkPhysicalDeviceFeatures *pVVar8;
  VkResult VVar9;
  VkBaseOutStructure **pnext;
  pointer ppVVar10;
  ulong uVar11;
  VkBaseOutStructure **pnext_1;
  VkBaseOutStructure **__args;
  CustomQueueDescription *desc;
  pointer pCVar12;
  pointer pbVar13;
  pointer pCVar14;
  Result<vkb::Device> *pRVar15;
  GenericFeaturesPNextNode *features_node;
  pointer pGVar16;
  initializer_list<float> __l;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> final_pnext_chain;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queueCreateInfos;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_enable;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
  queue_descriptions;
  GenericFeatureChain physical_device_extension_features_copy;
  VkDeviceCreateInfo device_create_info;
  Device device;
  VkPhysicalDeviceFeatures2 local_features2;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> local_928;
  VkDeviceQueueCreateInfo *local_908;
  iterator iStack_900;
  VkDeviceQueueCreateInfo *local_8f8;
  Result<vkb::Device> *local_8f0;
  char **local_8e8;
  long lStack_8e0;
  long local_8d8;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> local_8c8;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_8a8;
  GenericFeatureChain *local_890;
  VkDeviceCreateInfo local_888;
  undefined1 local_838 [8];
  _Alloc_hider _Stack_830;
  pointer local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_820;
  undefined1 local_810 [240];
  undefined1 local_720 [296];
  undefined1 local_5f8 [528];
  undefined1 local_3e8 [520];
  uint32_t local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1c0;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_1a8;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  vStack_190;
  undefined2 local_178;
  undefined2 uStack_176;
  Suitable SStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> vStack_168;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint32_t uStack_140;
  PFN_vkGetDeviceQueue local_138;
  PFN_vkDestroyDevice p_Stack_130;
  VkStructureType local_120;
  
  local_8c8.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8f0 = __return_storage_ptr__;
  std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<vkb::CustomQueueDescription_const*,std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>>>
            ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
             &local_8c8,0,
             (this->info).queue_descriptions.
             super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->info).queue_descriptions.
             super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pCVar14 = local_8c8.
            super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((local_8c8.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_8c8.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_120 = VK_STRUCTURE_TYPE_APPLICATION_INFO,
     pCVar14 = local_8c8.
               super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->physical_device).queue_families.
     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
     super__Vector_impl_data._M_finish !=
     (this->physical_device).queue_families.
     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
     super__Vector_impl_data._M_start)) {
    do {
      local_888.sType = 0x3f800000;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_888;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_838,__l,(allocator_type *)&local_908
                );
      std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
      emplace_back<unsigned_int&,std::vector<float,std::allocator<float>>>
                ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
                 &local_8c8,&stack0xfffffffffffffee0,
                 (vector<float,_std::allocator<float>_> *)local_838);
      if (local_838 != (undefined1  [8])0x0) {
        operator_delete((void *)local_838,(long)local_828 - (long)local_838);
      }
      local_120 = local_120 + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
      uVar11 = ((long)(this->physical_device).queue_families.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->physical_device).queue_families.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      pCVar14 = local_8c8.
                super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (local_120 <= uVar11 && uVar11 - local_120 != 0);
  }
  local_908 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_900._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_8f8 = (VkDeviceQueueCreateInfo *)0x0;
  if (local_8c8.
      super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != pCVar14) {
    pCVar12 = local_8c8.
              super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      _Stack_830._M_p = (pointer)0x0;
      local_838 = (undefined1  [8])0x2;
      local_828 = (pointer)((ulong)pCVar12->index << 0x20);
      aStack_820._8_8_ =
           (pCVar12->priorities).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      aStack_820._M_allocated_capacity =
           (ulong)((long)(pCVar12->priorities).super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_finish - aStack_820._8_8_) >> 2 &
           0xffffffff;
      if (iStack_900._M_current == local_8f8) {
        std::vector<VkDeviceQueueCreateInfo,std::allocator<VkDeviceQueueCreateInfo>>::
        _M_realloc_insert<VkDeviceQueueCreateInfo_const&>
                  ((vector<VkDeviceQueueCreateInfo,std::allocator<VkDeviceQueueCreateInfo>> *)
                   &local_908,iStack_900,(VkDeviceQueueCreateInfo *)local_838);
      }
      else {
        (iStack_900._M_current)->pQueuePriorities = (float *)aStack_820._8_8_;
        *(pointer *)&(iStack_900._M_current)->flags = local_828;
        *(size_type *)&(iStack_900._M_current)->queueCount = aStack_820._M_allocated_capacity;
        *(undefined8 *)iStack_900._M_current = 2;
        (iStack_900._M_current)->pNext = (void *)0x0;
        iStack_900._M_current = iStack_900._M_current + 1;
      }
      pCVar12 = pCVar12 + 1;
    } while (pCVar12 != pCVar14);
  }
  local_8e8 = (char **)0x0;
  lStack_8e0 = 0;
  local_8d8 = 0;
  pbVar13 = (this->physical_device).extensions_to_enable.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->physical_device).extensions_to_enable.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar1) {
    do {
      local_838 = (undefined1  [8])(pbVar13->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_8e8,(char **)local_838);
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar1);
  }
  if (((this->physical_device).surface != (VkSurfaceKHR)0x0) ||
     ((this->physical_device).defer_surface_initialization == true)) {
    local_838 = (undefined1  [8])0x115b72;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_8e8,(char **)local_838);
  }
  local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (VkBaseOutStructure **)0x0;
  local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (VkBaseOutStructure **)0x0;
  local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (VkBaseOutStructure **)0x0;
  local_888.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  local_888.enabledExtensionCount = 0;
  local_888._52_4_ = 0;
  local_888.ppEnabledExtensionNames = (char **)0x0;
  local_888.enabledLayerCount = 0;
  local_888._36_4_ = 0;
  local_888.ppEnabledLayerNames = (char **)0x0;
  local_888.flags = 0;
  local_888.queueCreateInfoCount = 0;
  local_888.pQueueCreateInfos = (VkDeviceQueueCreateInfo *)0x0;
  local_888.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_888._4_4_ = 0;
  local_888.pNext = (void *)0x0;
  ppVVar10 = (this->info).pNext_chain.
             super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  bVar6 = true;
  do {
    if (ppVVar10 ==
        (this->info).pNext_chain.
        super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0010a1f4:
      local_890 = &(this->physical_device).extended_features_chain;
      std::
      vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ::vector(&local_8a8,&local_890->nodes);
      memset((pointer)&stack0xfffffffffffffee0,0,0xf0);
      local_120 = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
      __src = &(this->physical_device).features;
      memcpy(&stack0xfffffffffffffef0,__src,0xdc);
      pVVar8 = local_888.pEnabledFeatures;
      if ((bVar6) &&
         (((0x400fff < (this->physical_device).instance_version ||
           (pVVar8 = __src, (this->physical_device).properties2_ext_enabled == true)) &&
          (local_838 = (undefined1  [8])&stack0xfffffffffffffee0,
          std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
          emplace_back<VkBaseOutStructure*>
                    ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_928,
                     (VkBaseOutStructure **)local_838), pVVar8 = local_888.pEnabledFeatures,
          local_8a8.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_8a8.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_finish)))) {
        pGVar16 = local_8a8.
                  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_838 = (undefined1  [8])pGVar16;
          std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
          emplace_back<VkBaseOutStructure*>
                    ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_928,
                     (VkBaseOutStructure **)local_838);
          pGVar16 = pGVar16 + 1;
          pVVar8 = local_888.pEnabledFeatures;
        } while (pGVar16 !=
                 local_8a8.
                 super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_888.pEnabledFeatures = pVVar8;
      ppVVar2 = (this->info).pNext_chain.
                super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (__args = (this->info).pNext_chain.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; __args != ppVVar2; __args = __args + 1
          ) {
        if (local_928.
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_928.
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
          _M_realloc_insert<VkBaseOutStructure*const&>
                    ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_928,
                     (iterator)
                     local_928.
                     super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = *__args;
          local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_928.
               super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      detail::setup_pNext_chain<VkDeviceCreateInfo>(&local_888,&local_928);
      for (ppVVar10 = local_928.
                      super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppVVar10 !=
          local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppVVar10 = ppVVar10 + 1) {
        if ((*ppVVar10)->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
          __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                        "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                        ,0x6a4,"Result<Device> vkb::DeviceBuilder::build() const");
        }
      }
      local_888.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
      local_888.queueCreateInfoCount =
           (int)((ulong)((long)iStack_900._M_current - (long)local_908) >> 3) * -0x33333333;
      local_888.flags = (this->info).flags;
      local_888.pQueueCreateInfos = local_908;
      local_888.enabledExtensionCount = (uint32_t)((ulong)(lStack_8e0 - (long)local_8e8) >> 3);
      local_888.ppEnabledExtensionNames = local_8e8;
      local_838 = (undefined1  [8])0x0;
      local_828 = (pointer)0x0;
      aStack_820._M_allocated_capacity = aStack_820._M_allocated_capacity & 0xffffffffffffff00;
      _Stack_830._M_p = (pointer)&aStack_820;
      memset(local_810,0,0xec);
      memset(local_720,0,0x124);
      memset(local_5f8,0,0x20c);
      memset(local_3e8,0,0x208);
      local_1e0 = 0x400000;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_190.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_190.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_190.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178._0_1_ = false;
      local_178._1_1_ = false;
      SStack_174 = yes;
      uStack_170 = 0;
      uStack_16c = 0;
      vStack_168.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      vStack_168.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      vStack_168.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      vStack_168.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      vStack_168.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      vStack_168.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_150 = 0;
      uStack_14c = 0;
      uStack_148 = 0;
      uStack_144 = 0;
      uStack_140 = 0x400000;
      local_138 = (PFN_vkGetDeviceQueue)0x0;
      p_Stack_130 = (PFN_vkDestroyDevice)0x0;
      VVar9 = (*(code *)detail::vulkan_functions()::v._184_8_)
                        ((this->physical_device).physical_device,&local_888,
                         (this->info).allocation_callbacks,local_838);
      if (VVar9 == VK_SUCCESS) {
        std::__cxx11::string::_M_assign((string *)&_Stack_830);
        memcpy(local_810,&(this->physical_device).physical_device,0x634);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_1d8,&(this->physical_device).extensions_to_enable);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&vStack_1c0,&(this->physical_device).available_extensions);
        __x = &(this->physical_device).queue_families;
        std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                  (&local_1a8,__x);
        std::
        vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ::operator=(&vStack_190,&local_890->nodes);
        uVar3._0_1_ = (this->physical_device).defer_surface_initialization;
        uVar3._1_1_ = (this->physical_device).properties2_ext_enabled;
        uVar3._2_2_ = *(undefined2 *)&(this->physical_device).field_0x6ba;
        uVar3._4_4_ = (this->physical_device).suitable;
        local_178 = (undefined2)uVar3;
        pVVar4 = (this->physical_device).surface;
        uStack_170 = SUB84(pVVar4,0);
        uStack_16c = (undefined4)((ulong)pVVar4 >> 0x20);
        uStack_176 = uVar3._2_2_;
        SStack_174 = uVar3._4_4_;
        std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                  (&vStack_168,__x);
        pVVar5 = (this->info).allocation_callbacks;
        uStack_150 = SUB84(pVVar5,0);
        uStack_14c = (undefined4)((ulong)pVVar5 >> 0x20);
        uStack_148 = (undefined4)detail::vulkan_functions()::v._192_8_;
        uStack_144 = SUB84(detail::vulkan_functions()::v._192_8_,4);
        local_138 = (PFN_vkGetDeviceQueue)
                    (*(code *)detail::vulkan_functions()::v._192_8_)(local_838,"vkGetDeviceQueue");
        p_Stack_130 = (PFN_vkDestroyDevice)
                      (*(code *)detail::vulkan_functions()::v._192_8_)(local_838,"vkDestroyDevice");
        pRVar15 = local_8f0;
        uStack_140 = (this->physical_device).instance_version;
        Result<vkb::Device>::Result(local_8f0,(Device *)local_838);
      }
      else {
        (local_8f0->field_0).m_error.type._M_value = 0;
        (local_8f0->field_0).m_value.physical_device.name._M_dataplus._M_p =
             (pointer)&detail::device_error_category;
        (local_8f0->field_0).m_error.vk_result = VVar9;
        local_8f0->m_init = false;
        pRVar15 = local_8f0;
      }
      pvVar7 = (void *)CONCAT44(vStack_168.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                vStack_168.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT44(vStack_168.
                                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                        vStack_168.
                                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                               (long)pvVar7);
      }
      if (vStack_190.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_190.
                        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_190.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_190.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a8.
          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.
                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_1c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_830._M_p != &aStack_820) {
        operator_delete(_Stack_830._M_p,aStack_820._M_allocated_capacity + 1);
      }
      if (local_8a8.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_8a8.
                        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_8a8.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_8a8.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_928.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (VkBaseOutStructure **)0x0) {
        operator_delete(local_928.
                        super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_928.
                              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_928.
                              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
LAB_0010a689:
      if (local_8e8 != (char **)0x0) {
        operator_delete(local_8e8,local_8d8 - (long)local_8e8);
      }
      if (local_908 != (VkDeviceQueueCreateInfo *)0x0) {
        operator_delete(local_908,(long)local_8f8 - (long)local_908);
      }
      std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::
      ~vector(&local_8c8);
      return pRVar15;
    }
    if ((*ppVVar10)->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
      if ((this->physical_device).extended_features_chain.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->physical_device).extended_features_chain.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (local_8f0->field_0).m_error.type._M_value = 1;
        (local_8f0->field_0).m_value.physical_device.name._M_dataplus._M_p =
             (pointer)&detail::device_error_category;
        (local_8f0->field_0).m_error.vk_result = VK_SUCCESS;
        local_8f0->m_init = false;
        pRVar15 = local_8f0;
        goto LAB_0010a689;
      }
      bVar6 = false;
      goto LAB_0010a1f4;
    }
    ppVVar10 = ppVVar10 + 1;
  } while( true );
}

Assistant:

Result<Device> DeviceBuilder::build() const {

    std::vector<CustomQueueDescription> queue_descriptions;
    queue_descriptions.insert(queue_descriptions.end(), info.queue_descriptions.begin(), info.queue_descriptions.end());

    if (queue_descriptions.empty()) {
        for (uint32_t i = 0; i < physical_device.queue_families.size(); i++) {
            queue_descriptions.emplace_back(i, std::vector<float>{ 1.0f });
        }
    }

    std::vector<VkDeviceQueueCreateInfo> queueCreateInfos;
    for (auto& desc : queue_descriptions) {
        VkDeviceQueueCreateInfo queue_create_info = {};
        queue_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
        queue_create_info.queueFamilyIndex = desc.index;
        queue_create_info.queueCount = static_cast<std::uint32_t>(desc.priorities.size());
        queue_create_info.pQueuePriorities = desc.priorities.data();
        queueCreateInfos.push_back(queue_create_info);
    }

    std::vector<const char*> extensions_to_enable;
    for (const auto& ext : physical_device.extensions_to_enable) {
        extensions_to_enable.push_back(ext.c_str());
    }
    if (physical_device.surface != VK_NULL_HANDLE || physical_device.defer_surface_initialization)
        extensions_to_enable.push_back({ VK_KHR_SWAPCHAIN_EXTENSION_NAME });

    std::vector<VkBaseOutStructure*> final_pnext_chain;
    VkDeviceCreateInfo device_create_info = {};

    bool user_defined_phys_dev_features_2 = false;
    for (auto& pnext : info.pNext_chain) {
        if (pnext->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
            user_defined_phys_dev_features_2 = true;
            break;
        }
    }

    if (user_defined_phys_dev_features_2 && !physical_device.extended_features_chain.nodes.empty()) {
        return { DeviceError::VkPhysicalDeviceFeatures2_in_pNext_chain_while_using_add_required_extension_features };
    }

    // These objects must be alive during the call to vkCreateDevice
    auto physical_device_extension_features_copy = physical_device.extended_features_chain;
    VkPhysicalDeviceFeatures2 local_features2{};
    local_features2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    local_features2.features = physical_device.features;

    if (!user_defined_phys_dev_features_2) {
        if (physical_device.instance_version >= VKB_VK_API_VERSION_1_1 || physical_device.properties2_ext_enabled) {
            final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&local_features2));
            for (auto& features_node : physical_device_extension_features_copy.nodes) {
                final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features_node));
            }
        } else {
            // Only set device_create_info.pEnabledFeatures when the pNext chain does not contain a VkPhysicalDeviceFeatures2 structure
            device_create_info.pEnabledFeatures = &physical_device.features;
        }
    }

    for (auto& pnext : info.pNext_chain) {
        final_pnext_chain.push_back(pnext);
    }

    detail::setup_pNext_chain(device_create_info, final_pnext_chain);
#if !defined(NDEBUG)
    for (auto& node : final_pnext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    device_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    device_create_info.flags = info.flags;
    device_create_info.queueCreateInfoCount = static_cast<uint32_t>(queueCreateInfos.size());
    device_create_info.pQueueCreateInfos = queueCreateInfos.data();
    device_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions_to_enable.size());
    device_create_info.ppEnabledExtensionNames = extensions_to_enable.data();

    Device device;

    VkResult res = detail::vulkan_functions().fp_vkCreateDevice(
        physical_device.physical_device, &device_create_info, info.allocation_callbacks, &device.device);
    if (res != VK_SUCCESS) {
        return { DeviceError::failed_create_device, res };
    }

    device.physical_device = physical_device;
    device.surface = physical_device.surface;
    device.queue_families = physical_device.queue_families;
    device.allocation_callbacks = info.allocation_callbacks;
    device.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkGetDeviceQueue, "vkGetDeviceQueue");
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkDestroyDevice, "vkDestroyDevice");
    device.instance_version = physical_device.instance_version;
    return device;
}